

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChHexahedronFace.h
# Opt level: O2

uint __thiscall chrono::fea::ChHexahedronFace::GetSubBlockOffset(ChHexahedronFace *this,int nblock)

{
  uint uVar1;
  undefined1 local_18 [16];
  
  GetNodeN((ChHexahedronFace *)local_18,(int)this);
  uVar1 = *(uint *)(local_18._0_8_ + 0xc + *(long *)(*(long *)local_18._0_8_ + -0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_18 + 8));
  return uVar1;
}

Assistant:

virtual unsigned int GetSubBlockOffset(int nblock) override { return GetNodeN(nblock)->NodeGetOffset_w(); }